

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

Imputer * __thiscall CoreML::Specification::Model::mutable_imputer(Model *this)

{
  bool bVar1;
  Imputer *this_00;
  Model *this_local;
  
  bVar1 = has_imputer(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_imputer(this);
    this_00 = (Imputer *)operator_new(0x30);
    Imputer::Imputer(this_00);
    (this->Type_).imputer_ = this_00;
  }
  return (Imputer *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::Imputer* Model::mutable_imputer() {
  if (!has_imputer()) {
    clear_Type();
    set_has_imputer();
    Type_.imputer_ = new ::CoreML::Specification::Imputer;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.imputer)
  return Type_.imputer_;
}